

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::LookupAny
          (PersistentStorageJson *this,Network *aValue,
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          *aRet)

{
  Status SVar1;
  _Any_data _Stack_78;
  code *local_68;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string local_38;
  
  local_58._8_8_ = 0;
  local_48 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Network_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:473:12)>
             ::_M_manager;
  local_40 = std::
             _Function_handler<bool_(const_ot::commissioner::persistent_storage::Network_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:473:12)>
             ::_M_invoke;
  local_58._M_unused._M_object = aValue;
  std::function<bool_(const_ot::commissioner::persistent_storage::Network_&)>::function
            ((function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *)&_Stack_78,
             (function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *)&local_58);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,JSON_NWK_abi_cxx11_,DAT_002984d8 + JSON_NWK_abi_cxx11_);
  SVar1 = LookupPred<ot::commissioner::persistent_storage::Network>
                    (this,(function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *)
                          &_Stack_78,aRet,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&_Stack_78,&_Stack_78,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::LookupAny(Network const &aValue, std::vector<Network> &aRet)
{
    std::function<bool(Network const &)> pred = [](Network const &) { return true; };

    pred = [&aValue](Network const &el) {
        bool aRet = (aValue.mCcm < 0 || aValue.mCcm == el.mCcm) ||
                    (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) ||
                    (aValue.mDomainId.mId == EMPTY_ID || (el.mDomainId.mId == aValue.mDomainId.mId)) ||
                    (aValue.mName.empty() || (aValue.mName == el.mName)) ||
                    (aValue.mXpan == 0 || aValue.mXpan == el.mXpan) || (aValue.mPan == 0 || (aValue.mPan == el.mPan)) ||
                    (aValue.mMlp.empty() || CaseInsensitiveEqual(aValue.mMlp, el.mMlp)) ||
                    (aValue.mChannel == 0 || (aValue.mChannel == el.mChannel));

        return aRet;
    };

    return LookupPred<Network>(pred, aRet, JSON_NWK);
}